

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11Xcb.cpp
# Opt level: O0

void __thiscall tcu::x11::XcbWindow::setVisibility(XcbWindow *this,bool visible)

{
  xcb_connection_t *pxVar1;
  bool visible_local;
  XcbWindow *this_local;
  
  if (visible != (bool)((this->super_WindowBase).m_visible & 1U)) {
    if (visible) {
      pxVar1 = XcbDisplay::getConnection(this->m_display);
      xcb_map_window(pxVar1,this->m_window);
    }
    else {
      pxVar1 = XcbDisplay::getConnection(this->m_display);
      xcb_unmap_window(pxVar1,this->m_window);
    }
    (this->super_WindowBase).m_visible = visible;
    pxVar1 = XcbDisplay::getConnection(this->m_display);
    xcb_flush(pxVar1);
  }
  return;
}

Assistant:

void XcbWindow::setVisibility (bool visible)
{
	if (visible == m_visible)
		return;

	if (visible)
		 xcb_map_window(m_display.getConnection(), m_window);
	else
		xcb_unmap_window(m_display.getConnection(), m_window);

	m_visible = visible;
	xcb_flush (m_display.getConnection());

}